

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  long *plVar4;
  _func_int *p_Var5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Layer *pLVar12;
  long lVar13;
  int iVar14;
  undefined4 *puVar15;
  void *pvVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  char cVar23;
  uint uVar24;
  int iVar25;
  Option opt_cpu;
  ParamDict pd;
  int local_65c;
  int local_658;
  int local_654;
  int local_650;
  undefined4 local_5f8;
  int iStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  Allocator *local_5e8;
  ulong uStack_5e0;
  undefined8 local_5d8;
  ParamDict local_5d0;
  
  local_5f8 = *(undefined4 *)opt;
  iStack_5f4 = opt->num_threads;
  uStack_5f0 = *(undefined4 *)&opt->blob_allocator;
  uStack_5ec = *(undefined4 *)((long)&opt->blob_allocator + 4);
  local_5e8 = opt->workspace_allocator;
  uStack_5e0._0_1_ = opt->vulkan_compute;
  uStack_5e0._1_3_ = *(undefined3 *)&opt->field_0x19;
  uStack_5e0._4_4_ = opt->use_winograd_convolution;
  local_5d8._0_4_ = opt->use_sgemm_convolution;
  local_5d8._4_4_ = opt->use_int8_inference;
  uStack_5e0 = uStack_5e0 & 0xffffffffffffff00;
  switch(*(undefined4 *)(&this->field_0xb0 + (long)this->_vptr_Convolution_x86[-3])) {
  case 1:
    pLVar12 = create_layer(0x1a);
    this->activation = pLVar12;
    ParamDict::ParamDict(&local_5d0);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_5d0);
    lVar17 = 0x560;
    do {
      piVar3 = *(int **)((long)&local_5d0.params[0].v.data + lVar17);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar16 = *(void **)((long)&local_5d0.params[0].loaded + lVar17);
          plVar4 = *(long **)((long)&local_5d0.params[0].v.packing + lVar17);
          if (plVar4 == (long *)0x0) {
            if (pvVar16 != (void *)0x0) {
              free(pvVar16);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar17) = 0;
      lVar17 = lVar17 + -0x48;
    } while (lVar17 != -0x40);
    break;
  case 2:
    pLVar12 = create_layer(0x1a);
    this->activation = pLVar12;
    ParamDict::ParamDict(&local_5d0);
    ParamDict::set(&local_5d0,0,
                   **(float **)(&this->field_0xb8 + (long)this->_vptr_Convolution_x86[-3]));
    (*this->activation->_vptr_Layer[2])(this->activation,&local_5d0);
    lVar17 = 0x560;
    do {
      piVar3 = *(int **)((long)&local_5d0.params[0].v.data + lVar17);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar16 = *(void **)((long)&local_5d0.params[0].loaded + lVar17);
          plVar4 = *(long **)((long)&local_5d0.params[0].v.packing + lVar17);
          if (plVar4 == (long *)0x0) {
            if (pvVar16 != (void *)0x0) {
              free(pvVar16);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar17) = 0;
      lVar17 = lVar17 + -0x48;
    } while (lVar17 != -0x40);
    break;
  case 3:
    pLVar12 = create_layer(0x36);
    this->activation = pLVar12;
    ParamDict::ParamDict(&local_5d0);
    ParamDict::set(&local_5d0,0,
                   **(float **)(&this->field_0xb8 + (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&local_5d0,1,
                   *(float *)(*(long *)(&this->field_0xb8 + (long)this->_vptr_Convolution_x86[-3]) +
                             4));
    (*this->activation->_vptr_Layer[2])(this->activation,&local_5d0);
    lVar17 = 0x560;
    do {
      piVar3 = *(int **)((long)&local_5d0.params[0].v.data + lVar17);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar16 = *(void **)((long)&local_5d0.params[0].loaded + lVar17);
          plVar4 = *(long **)((long)&local_5d0.params[0].v.packing + lVar17);
          if (plVar4 == (long *)0x0) {
            if (pvVar16 != (void *)0x0) {
              free(pvVar16);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar17) = 0;
      lVar17 = lVar17 + -0x48;
    } while (lVar17 != -0x40);
    break;
  case 4:
    pLVar12 = create_layer(0x1e);
    this->activation = pLVar12;
    ParamDict::ParamDict(&local_5d0);
    (*this->activation->_vptr_Layer[2])(this->activation,&local_5d0);
    lVar17 = 0x560;
    do {
      piVar3 = *(int **)((long)&local_5d0.params[0].v.data + lVar17);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar16 = *(void **)((long)&local_5d0.params[0].loaded + lVar17);
          plVar4 = *(long **)((long)&local_5d0.params[0].v.packing + lVar17);
          if (plVar4 == (long *)0x0) {
            if (pvVar16 != (void *)0x0) {
              free(pvVar16);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.refcount + lVar17 + 4) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].loaded + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.data + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.allocator + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.dims + lVar17) = 0;
      *(undefined8 *)((long)&local_5d0.params[0].v.h + lVar17) = 0;
      lVar17 = lVar17 + -0x48;
    } while (lVar17 != -0x40);
  }
  pLVar12 = this->activation;
  if (pLVar12 != (Layer *)0x0) {
    (*pLVar12->_vptr_Layer[4])(pLVar12,&local_5f8);
  }
  this->use_winograd3x3 = false;
  p_Var5 = this->_vptr_Convolution_x86[-3];
  if ((&this->field_0x1c0)[(long)p_Var5] == '\0') {
    iVar19 = *(int *)((long)&(this->weight_sgemm_data).w + (long)p_Var5) *
             *(int *)((long)&(this->weight_sgemm_data).h + (long)p_Var5);
    uVar21 = (long)*(int *)(&this->field_0xa8 + (long)p_Var5) / (long)iVar19;
    uVar2 = *(uint *)((long)&(this->weight_sgemm_data).dims + (long)p_Var5);
    uVar22 = (ulong)(int)uVar2;
    uVar8 = uVar2 + 7;
    if (-1 < (long)uVar22) {
      uVar8 = uVar2;
    }
    lVar17 = *(long *)(&this->field_0xf8 + (long)p_Var5);
    cVar23 = (char)((int)uVar2 % 8);
    iVar11 = 0;
    iVar25 = (int)((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff) /
                  (long)(int)uVar2);
    Mat::create(&this->weight_sgemm_data,iVar19 * 8,iVar25,
                (int)uVar2 % 4 + ((int)uVar8 >> 3) +
                (int)((char)(((byte)(cVar23 >> 7) >> 6) + cVar23) >> 2),4,(Allocator *)0x0);
    uVar8 = (int)uVar2 >> 3;
    if (0 < (int)uVar8) {
      iVar20 = iVar25 * iVar19;
      pvVar16 = (this->weight_sgemm_data).data;
      sVar6 = (this->weight_sgemm_data).elemsize;
      sVar7 = (this->weight_sgemm_data).cstep;
      iVar9 = iVar25 * iVar19;
      iVar1 = iVar9 * 8;
      local_650 = iVar9 * 7;
      iVar10 = iVar9 * 2;
      local_654 = iVar9 * 6;
      local_658 = iVar9 * 5;
      local_65c = iVar9 * 3;
      iVar9 = iVar9 * 4;
      uVar21 = 0;
      iVar14 = iVar20;
      do {
        if (0 < iVar20) {
          lVar13 = 0;
          iVar18 = iVar20;
          do {
            *(undefined4 *)((long)pvVar16 + lVar13 * 8) =
                 *(undefined4 *)(lVar17 + (long)iVar11 * 4 + lVar13);
            *(undefined4 *)((long)pvVar16 + lVar13 * 8 + 4) =
                 *(undefined4 *)(lVar17 + (long)iVar14 * 4 + lVar13);
            *(undefined4 *)((long)pvVar16 + lVar13 * 8 + 8) =
                 *(undefined4 *)(lVar17 + (long)iVar10 * 4 + lVar13);
            *(undefined4 *)((long)pvVar16 + lVar13 * 8 + 0xc) =
                 *(undefined4 *)(lVar17 + (long)local_65c * 4 + lVar13);
            *(undefined4 *)((long)pvVar16 + lVar13 * 8 + 0x10) =
                 *(undefined4 *)(lVar17 + (long)iVar9 * 4 + lVar13);
            *(undefined4 *)((long)pvVar16 + lVar13 * 8 + 0x14) =
                 *(undefined4 *)(lVar17 + (long)local_658 * 4 + lVar13);
            *(undefined4 *)((long)pvVar16 + lVar13 * 8 + 0x18) =
                 *(undefined4 *)(lVar17 + (long)local_654 * 4 + lVar13);
            *(undefined4 *)((long)pvVar16 + lVar13 * 8 + 0x1c) =
                 *(undefined4 *)(lVar17 + (long)local_650 * 4 + lVar13);
            lVar13 = lVar13 + 4;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
        uVar21 = uVar21 + 1;
        pvVar16 = (void *)((long)pvVar16 + sVar6 * sVar7);
        local_650 = local_650 + iVar1;
        local_654 = local_654 + iVar1;
        local_658 = local_658 + iVar1;
        iVar9 = iVar9 + iVar1;
        local_65c = local_65c + iVar1;
        iVar10 = iVar10 + iVar1;
        iVar14 = iVar14 + iVar1;
        iVar11 = iVar11 + iVar1;
      } while (uVar21 != uVar8);
    }
    uVar24 = uVar2 & 0xfffffff8;
    if (((uVar22 >> 2 & 1) != 0) && (iVar11 = iVar25 * iVar19, 0 < iVar11)) {
      puVar15 = (undefined4 *)
                ((long)(int)uVar8 * (this->weight_sgemm_data).cstep *
                 (this->weight_sgemm_data).elemsize + (long)(this->weight_sgemm_data).data);
      lVar13 = 0;
      do {
        *puVar15 = *(undefined4 *)(lVar17 + (long)(int)(iVar11 * uVar24) * 4 + lVar13 * 4);
        puVar15[1] = *(undefined4 *)(lVar17 + (long)(int)((uVar24 + 1) * iVar11) * 4 + lVar13 * 4);
        puVar15[2] = *(undefined4 *)(lVar17 + (long)(int)((uVar24 + 2) * iVar11) * 4 + lVar13 * 4);
        puVar15[3] = *(undefined4 *)(lVar17 + (long)(int)((uVar24 + 3) * iVar11) * 4 + lVar13 * 4);
        lVar13 = lVar13 + 1;
        puVar15 = puVar15 + 4;
      } while (iVar11 != (int)lVar13);
    }
    iVar11 = uVar24 + ((uint)(uVar22 >> 2) & 1) * 4;
    if (iVar11 < (int)uVar2) {
      iVar25 = iVar25 * iVar19;
      sVar6 = (this->weight_sgemm_data).elemsize;
      sVar7 = (this->weight_sgemm_data).cstep;
      pvVar16 = (this->weight_sgemm_data).data;
      uVar21 = (ulong)iVar11;
      iVar11 = iVar25 * iVar11;
      do {
        if (0 < iVar25) {
          uVar2 = (uint)uVar21;
          uVar24 = uVar2 + 7;
          uVar8 = uVar2 + 3;
          if (-1 < (int)uVar2) {
            uVar24 = uVar2;
            uVar8 = uVar2;
          }
          cVar23 = (char)uVar21 - ((byte)uVar24 & 0xf8);
          lVar13 = 0;
          do {
            *(undefined4 *)
             ((long)pvVar16 +
             lVar13 * 4 +
             (long)(int)((int)((char)(((byte)(cVar23 >> 7) >> 6) + cVar23) >> 2) +
                        ((int)uVar24 >> 3) + (uVar2 - (uVar8 & 0xfffffffc))) * sVar6 * sVar7) =
                 *(undefined4 *)(lVar17 + (long)iVar11 * 4 + lVar13 * 4);
            lVar13 = lVar13 + 1;
          } while (iVar25 != (int)lVar13);
        }
        uVar21 = uVar21 + 1;
        iVar11 = iVar11 + iVar25;
      } while (uVar21 != uVar22);
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// min
        pd.set(1, activation_params[1]);// max
        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt_cpu);
    }

    use_winograd3x3 = false;

    if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        int num_input = weight_data_size / 9 / num_output;
        // winograd is slow on small channel count
        if(num_input >= 16 && num_output >= 16)
            use_winograd3x3 = false;
    }           

    if (use_winograd3x3)
    {
        int num_input = weight_data_size / 9 / num_output;

        if (use_int8_inference)
            // conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
            conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
        else
            // conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
            conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
    }

    if (use_int8_inference == false)
    {
        int kernel_size = kernel_w * kernel_h;
        int num_input = weight_data_size / kernel_size / num_output;

        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }       

    return 0;
}